

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O1

void __thiscall
Assimp::ComputeUVMappingProcess::ComputePlaneMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  float fVar1;
  aiVector3D *paVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  aiVector3D max;
  aiVector3D min;
  aiVector3D center;
  aiMatrix4x4 mTrafo;
  aiVector3D local_b4;
  aiVector3D local_a8;
  aiVector3D local_98;
  aiMatrix4x4 local_8c;
  aiMatrix3x3t<float> local_4c;
  
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_98.z = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  local_b4.x = 0.0;
  local_b4.y = 0.0;
  local_b4.z = 0.0;
  fVar1 = axis->x;
  fVar5 = axis->y * 0.0;
  fVar6 = axis->z * 0.0;
  if (0.95 <= fVar1 + fVar5 + fVar6) {
    FindMeshCenter(mesh,&local_98,&local_a8,&local_b4);
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        fVar1 = *(float *)((long)mesh->mVertices + lVar3 + -4);
        *(float *)((long)out + lVar3 + -8) =
             (*(float *)((long)&mesh->mVertices->x + lVar3) - local_a8.z) /
             (local_b4.z - local_a8.z);
        *(float *)((long)out + lVar3 + -4) = (fVar1 - local_a8.y) / (local_b4.y - local_a8.y);
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= fVar6 + fVar1 * 0.0 + axis->y) {
    FindMeshCenter(mesh,&local_98,&local_a8,&local_b4);
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        fVar1 = *(float *)((long)&mesh->mVertices->x + lVar3);
        *(float *)((long)out + lVar3 + -8) =
             (*(float *)((long)mesh->mVertices + lVar3 + -8) - local_a8.x) /
             (local_b4.x - local_a8.x);
        *(float *)((long)out + lVar3 + -4) = (fVar1 - local_a8.z) / (local_b4.z - local_a8.z);
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
  }
  else if (0.95 <= axis->z + fVar1 * 0.0 + fVar5) {
    FindMeshCenter(mesh,&local_98,&local_a8,&local_b4);
    if (mesh->mNumVertices != 0) {
      lVar3 = 4;
      uVar4 = 0;
      do {
        fVar1 = *(float *)((long)&mesh->mVertices->x + lVar3);
        *(float *)((long)out + lVar3 + -4) =
             (*(float *)((long)mesh->mVertices + lVar3 + -4) - local_a8.x) /
             (local_b4.x - local_a8.x);
        *(float *)((long)&out->x + lVar3) = (fVar1 - local_a8.y) / (local_b4.y - local_a8.y);
        *(undefined4 *)((long)&out->y + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
  }
  else {
    local_8c.a1 = 1.0;
    local_8c.a2 = 0.0;
    local_8c.a3 = 0.0;
    local_8c.a4 = 0.0;
    local_8c.b1 = 0.0;
    local_8c.b2 = 1.0;
    local_8c.b3 = 0.0;
    local_8c.b4 = 0.0;
    local_8c.c1 = 0.0;
    local_8c.c2 = 0.0;
    local_8c.c3 = 1.0;
    local_8c.c4 = 0.0;
    local_8c.d1 = 0.0;
    local_8c.d2 = 0.0;
    local_8c.d3 = 0.0;
    local_8c.d4 = 1.0;
    local_4c.a1 = 1.0;
    local_4c.a2 = 0.0;
    local_4c.a3 = 0.0;
    local_4c.b1 = 0.0;
    local_4c.b2 = 1.0;
    local_4c.b3 = 0.0;
    local_4c.c1 = 0.0;
    local_4c.c2 = 0.0;
    local_4c.c3 = 1.0;
    aiMatrix3x3t<float>::FromToMatrix
              (axis,(aiVector3t<float> *)::(anonymous_namespace)::base_axis_y,&local_4c);
    local_8c.a1 = local_4c.a1;
    local_8c.a2 = local_4c.a2;
    local_8c.a3 = local_4c.a3;
    local_8c.a4 = 0.0;
    local_8c.b1 = local_4c.b1;
    local_8c.b2 = local_4c.b2;
    local_8c.b4 = 0.0;
    local_8c.b3 = local_4c.b3;
    local_8c.c1 = local_4c.c1;
    local_8c.c2 = local_4c.c2;
    local_8c.c3 = local_4c.c3;
    local_8c.c4 = 0.0;
    local_8c.d1 = 0.0;
    local_8c.d2 = 0.0;
    local_8c.d3 = 0.0;
    local_8c.d4 = 1.0;
    FindMeshCenterTransformed(mesh,&local_98,&local_a8,&local_b4,&local_8c);
    if (mesh->mNumVertices != 0) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        paVar2 = mesh->mVertices;
        fVar1 = *(float *)((long)paVar2 + lVar3 + -8);
        fVar5 = *(float *)((long)paVar2 + lVar3 + -4);
        fVar6 = *(float *)((long)&paVar2->x + lVar3);
        *(float *)((long)out + lVar3 + -8) =
             ((local_8c.a3 * fVar6 + local_8c.a1 * fVar1 + local_8c.a2 * fVar5 + local_8c.a4) -
             local_a8.x) / (local_b4.x - local_a8.x);
        *(float *)((long)out + lVar3 + -4) =
             ((fVar6 * local_8c.c3 + fVar1 * local_8c.c1 + fVar5 * local_8c.c2 + local_8c.c4) -
             local_a8.z) / (local_b4.z - local_a8.z);
        *(undefined4 *)((long)&out->x + lVar3) = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0xc;
      } while (uVar4 < mesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputePlaneMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    ai_real diffu,diffv;
    aiVector3D center, min, max;

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.z - min.z;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.z - min.z) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        diffu = max.x - min.x;
        diffv = max.y - min.y;

        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.y - min.y) / diffv,0.0);
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else
    {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);
        FindMeshCenterTransformed(mesh, center, min, max,mTrafo);
        diffu = max.x - min.x;
        diffv = max.z - min.z;

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D pos = mTrafo * mesh->mVertices[pnt];
            out[pnt].Set((pos.x - min.x) / diffu,(pos.z - min.z) / diffv,0.0);
        }
    }

    // shouldn't be necessary to remove UV seams ...
}